

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O0

bool __thiscall
cmInstallCommand::HandleExportAndroidMKMode
          (cmInstallCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  bool bVar1;
  bool exportOld_00;
  uint uVar2;
  MessageLevel message_00;
  const_reference pvVar3;
  ostream *poVar4;
  reference pvVar5;
  ulong uVar6;
  string *psVar7;
  long lVar8;
  cmGlobalGenerator *this_00;
  cmExportSetMap *this_01;
  cmExportSet *exportSet_00;
  cmInstallExportGenerator *this_02;
  char *destination;
  char *file_permissions;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *configurations;
  char *component;
  char *filename_00;
  char *name_space_00;
  bool local_1059;
  cmInstallExportGenerator *exportGenerator;
  MessageLevel message;
  cmExportSet *exportSet;
  undefined1 local_fa8 [8];
  ostringstream e_4;
  string local_e30;
  undefined1 local_e10 [8];
  ostringstream e_3;
  string local_c90;
  string local_c70;
  undefined1 local_c50 [8];
  ostringstream e_2;
  undefined1 local_ad8 [8];
  string fname;
  undefined1 local_a98 [8];
  ostringstream e_1;
  string local_918;
  undefined1 local_8f8 [8];
  ostringstream e;
  undefined1 local_780 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  cmCAString filename;
  cmCAEnabler exportOld;
  cmCAString name_space;
  cmCAString exp;
  string local_598;
  undefined1 local_578 [8];
  cmInstallCommandArguments ica;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmInstallCommand *this_local;
  
  ica.DefaultComponentName.field_2._8_8_ = args;
  std::__cxx11::string::string((string *)&local_598,(string *)&this->DefaultComponentName);
  cmInstallCommandArguments::cmInstallCommandArguments
            ((cmInstallCommandArguments *)local_578,&local_598);
  std::__cxx11::string::~string((string *)&local_598);
  cmCAString::cmCAString
            ((cmCAString *)&name_space.DataStart,(cmCommandArgumentsHelper *)local_578,
             "EXPORT_ANDROID_MK",(cmCommandArgumentGroup *)0x0);
  cmCAString::cmCAString
            ((cmCAString *)&exportOld.Enabled,(cmCommandArgumentsHelper *)local_578,"NAMESPACE",
             (cmCommandArgumentGroup *)
             &ica.Parser.Arguments.
              super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cmCAEnabler::cmCAEnabler
            ((cmCAEnabler *)&filename.DataStart,(cmCommandArgumentsHelper *)local_578,
             "EXPORT_LINK_INTERFACE_LIBRARIES",
             (cmCommandArgumentGroup *)
             &ica.Parser.Arguments.
              super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cmCAString::cmCAString
            ((cmCAString *)
             &unknownArgs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (cmCommandArgumentsHelper *)local_578,"FILE",
             (cmCommandArgumentGroup *)
             &ica.Parser.Arguments.
              super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cmCommandArgument::Follows((cmCommandArgument *)&name_space.DataStart,(cmCommandArgument *)0x0);
  cmCommandArgumentGroup::Follows
            ((cmCommandArgumentGroup *)
             &ica.Parser.Arguments.
              super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(cmCommandArgument *)&name_space.DataStart);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_780);
  cmInstallCommandArguments::Parse
            ((cmInstallCommandArguments *)local_578,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)ica.DefaultComponentName.field_2._8_8_,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_780);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_780);
  if (bVar1) {
    bVar1 = cmInstallCommandArguments::Finalize((cmInstallCommandArguments *)local_578);
    if (bVar1) {
      cmInstallCommandArguments::GetDestination_abi_cxx11_((cmInstallCommandArguments *)local_578);
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        psVar7 = cmCAString::GetString_abi_cxx11_
                           ((cmCAString *)
                            &unknownArgs.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::string((string *)local_ad8,(string *)psVar7);
        lVar8 = std::__cxx11::string::find_first_of(local_ad8,0x77b3d0);
        if (lVar8 == -1) {
          uVar2 = std::__cxx11::string::empty();
          local_1059 = false;
          if ((uVar2 & 1) == 0) {
            cmsys::SystemTools::GetFilenameLastExtension(&local_c90,(string *)local_ad8);
            local_1059 = std::operator!=(&local_c90,".mk");
            std::__cxx11::string::~string((string *)&local_c90);
          }
          if (local_1059 == false) {
            lVar8 = std::__cxx11::string::find_first_of(local_ad8,0x77b3d0);
            if (lVar8 == -1) {
              uVar6 = std::__cxx11::string::empty();
              if ((uVar6 & 1) != 0) {
                std::__cxx11::string::operator=((string *)local_ad8,"Android.mk");
              }
              this_00 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
              this_01 = cmGlobalGenerator::GetExportSets(this_00);
              psVar7 = cmCAString::GetString_abi_cxx11_((cmCAString *)&name_space.DataStart);
              exportSet_00 = cmExportSetMap::operator[](this_01,psVar7);
              message_00 = cmInstallGenerator::SelectMessageLevel
                                     ((this->super_cmCommand).Makefile,false);
              this_02 = (cmInstallExportGenerator *)operator_new(0x178);
              cmInstallCommandArguments::GetDestination_abi_cxx11_
                        ((cmInstallCommandArguments *)local_578);
              destination = (char *)std::__cxx11::string::c_str();
              cmInstallCommandArguments::GetPermissions_abi_cxx11_
                        ((cmInstallCommandArguments *)local_578);
              file_permissions = (char *)std::__cxx11::string::c_str();
              configurations =
                   cmInstallCommandArguments::GetConfigurations_abi_cxx11_
                             ((cmInstallCommandArguments *)local_578);
              cmInstallCommandArguments::GetComponent_abi_cxx11_
                        ((cmInstallCommandArguments *)local_578);
              component = (char *)std::__cxx11::string::c_str();
              bVar1 = cmInstallCommandArguments::GetExcludeFromAll
                                ((cmInstallCommandArguments *)local_578);
              filename_00 = (char *)std::__cxx11::string::c_str();
              name_space_00 = cmCAString::GetCString((cmCAString *)&exportOld.Enabled);
              exportOld_00 = cmCAEnabler::IsEnabled((cmCAEnabler *)&filename.DataStart);
              cmInstallExportGenerator::cmInstallExportGenerator
                        (this_02,exportSet_00,destination,file_permissions,configurations,component,
                         message_00,bVar1,filename_00,name_space_00,exportOld_00,true);
              cmMakefile::AddInstallGenerator
                        ((this->super_cmCommand).Makefile,(cmInstallGenerator *)this_02);
              this_local._7_1_ = true;
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_fa8);
              pvVar3 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)ica.DefaultComponentName.field_2._8_8_,0);
              poVar4 = std::operator<<((ostream *)local_fa8,(string *)pvVar3);
              poVar4 = std::operator<<(poVar4," given export name \"");
              psVar7 = cmCAString::GetString_abi_cxx11_((cmCAString *)&name_space.DataStart);
              poVar4 = std::operator<<(poVar4,(string *)psVar7);
              poVar4 = std::operator<<(poVar4,"\".  ");
              poVar4 = std::operator<<(poVar4,
                                       "This name cannot be safely converted to a file name.  ");
              poVar4 = std::operator<<(poVar4,
                                       "Specify a different export name or use the FILE option to set "
                                      );
              std::operator<<(poVar4,"a file name explicitly.");
              std::__cxx11::ostringstream::str();
              cmCommand::SetError(&this->super_cmCommand,(string *)&exportSet);
              std::__cxx11::string::~string((string *)&exportSet);
              this_local._7_1_ = false;
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_fa8);
            }
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_e10);
            pvVar3 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)ica.DefaultComponentName.field_2._8_8_,0);
            poVar4 = std::operator<<((ostream *)local_e10,(string *)pvVar3);
            poVar4 = std::operator<<(poVar4," given invalid export file name \"");
            poVar4 = std::operator<<(poVar4,(string *)local_ad8);
            poVar4 = std::operator<<(poVar4,"\".  ");
            std::operator<<(poVar4,"The FILE argument must specify a name ending in \".mk\".");
            std::__cxx11::ostringstream::str();
            cmCommand::SetError(&this->super_cmCommand,&local_e30);
            std::__cxx11::string::~string((string *)&local_e30);
            this_local._7_1_ = false;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_e10);
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c50);
          pvVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)ica.DefaultComponentName.field_2._8_8_,0);
          poVar4 = std::operator<<((ostream *)local_c50,(string *)pvVar3);
          poVar4 = std::operator<<(poVar4," given invalid export file name \"");
          poVar4 = std::operator<<(poVar4,(string *)local_ad8);
          poVar4 = std::operator<<(poVar4,"\".  ");
          poVar4 = std::operator<<(poVar4,"The FILE argument may not contain a path.  ");
          std::operator<<(poVar4,"Specify the path in the DESTINATION argument.");
          std::__cxx11::ostringstream::str();
          cmCommand::SetError(&this->super_cmCommand,&local_c70);
          std::__cxx11::string::~string((string *)&local_c70);
          this_local._7_1_ = false;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c50);
        }
        std::__cxx11::string::~string((string *)local_ad8);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a98);
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)ica.DefaultComponentName.field_2._8_8_,0);
        poVar4 = std::operator<<((ostream *)local_a98,(string *)pvVar3);
        std::operator<<(poVar4," given no DESTINATION!");
        std::__cxx11::ostringstream::str();
        cmCommand::SetError(&this->super_cmCommand,(string *)((long)&fname.field_2 + 8));
        std::__cxx11::string::~string((string *)(fname.field_2._M_local_buf + 8));
        this_local._7_1_ = false;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_a98);
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_8f8);
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)ica.DefaultComponentName.field_2._8_8_,0);
    poVar4 = std::operator<<((ostream *)local_8f8,(string *)pvVar3);
    poVar4 = std::operator<<(poVar4," given unknown argument \"");
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_780,0);
    poVar4 = std::operator<<(poVar4,(string *)pvVar5);
    std::operator<<(poVar4,"\".");
    std::__cxx11::ostringstream::str();
    cmCommand::SetError(&this->super_cmCommand,&local_918);
    std::__cxx11::string::~string((string *)&local_918);
    this_local._7_1_ = false;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_8f8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_780);
  cmCAString::~cmCAString
            ((cmCAString *)
             &unknownArgs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cmCAEnabler::~cmCAEnabler((cmCAEnabler *)&filename.DataStart);
  cmCAString::~cmCAString((cmCAString *)&exportOld.Enabled);
  cmCAString::~cmCAString((cmCAString *)&name_space.DataStart);
  cmInstallCommandArguments::~cmInstallCommandArguments((cmInstallCommandArguments *)local_578);
  return this_local._7_1_;
}

Assistant:

bool cmInstallCommand::HandleExportAndroidMKMode(
  std::vector<std::string> const& args)
{
#ifdef CMAKE_BUILD_WITH_CMAKE
  // This is the EXPORT mode.
  cmInstallCommandArguments ica(this->DefaultComponentName);
  cmCAString exp(&ica.Parser, "EXPORT_ANDROID_MK");
  cmCAString name_space(&ica.Parser, "NAMESPACE", &ica.ArgumentGroup);
  cmCAEnabler exportOld(&ica.Parser, "EXPORT_LINK_INTERFACE_LIBRARIES",
                        &ica.ArgumentGroup);
  cmCAString filename(&ica.Parser, "FILE", &ica.ArgumentGroup);
  exp.Follows(nullptr);

  ica.ArgumentGroup.Follows(&exp);
  std::vector<std::string> unknownArgs;
  ica.Parse(&args, &unknownArgs);

  if (!unknownArgs.empty()) {
    // Unknown argument.
    std::ostringstream e;
    e << args[0] << " given unknown argument \"" << unknownArgs[0] << "\".";
    this->SetError(e.str());
    return false;
  }

  if (!ica.Finalize()) {
    return false;
  }

  // Make sure there is a destination.
  if (ica.GetDestination().empty()) {
    // A destination is required.
    std::ostringstream e;
    e << args[0] << " given no DESTINATION!";
    this->SetError(e.str());
    return false;
  }

  // Check the file name.
  std::string fname = filename.GetString();
  if (fname.find_first_of(":/\\") != std::string::npos) {
    std::ostringstream e;
    e << args[0] << " given invalid export file name \"" << fname << "\".  "
      << "The FILE argument may not contain a path.  "
      << "Specify the path in the DESTINATION argument.";
    this->SetError(e.str());
    return false;
  }

  // Check the file extension.
  if (!fname.empty() &&
      cmSystemTools::GetFilenameLastExtension(fname) != ".mk") {
    std::ostringstream e;
    e << args[0] << " given invalid export file name \"" << fname << "\".  "
      << "The FILE argument must specify a name ending in \".mk\".";
    this->SetError(e.str());
    return false;
  }
  if (fname.find_first_of(":/\\") != std::string::npos) {
    std::ostringstream e;
    e << args[0] << " given export name \"" << exp.GetString() << "\".  "
      << "This name cannot be safely converted to a file name.  "
      << "Specify a different export name or use the FILE option to set "
      << "a file name explicitly.";
    this->SetError(e.str());
    return false;
  }
  // Use the default name
  if (fname.empty()) {
    fname = "Android.mk";
  }

  cmExportSet* exportSet =
    this->Makefile->GetGlobalGenerator()->GetExportSets()[exp.GetString()];

  cmInstallGenerator::MessageLevel message =
    cmInstallGenerator::SelectMessageLevel(this->Makefile);

  // Create the export install generator.
  cmInstallExportGenerator* exportGenerator = new cmInstallExportGenerator(
    exportSet, ica.GetDestination().c_str(), ica.GetPermissions().c_str(),
    ica.GetConfigurations(), ica.GetComponent().c_str(), message,
    ica.GetExcludeFromAll(), fname.c_str(), name_space.GetCString(),
    exportOld.IsEnabled(), true);
  this->Makefile->AddInstallGenerator(exportGenerator);

  return true;
#else
  static_cast<void>(args);
  this->SetError("EXPORT_ANDROID_MK not supported in bootstrap cmake");
  return false;
#endif
}